

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O0

void __thiscall
cpp_bindgen::cpp_bindgen::anon_unknown_0::FortranArrayView_CArrayReferenceIsBindable_Test::
FortranArrayView_CArrayReferenceIsBindable_Test
          (FortranArrayView_CArrayReferenceIsBindable_Test *this)

{
  FortranArrayView_CArrayReferenceIsBindable_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__FortranArrayView_CArrayReferenceIsBindable_Test_0017bc68;
  return;
}

Assistant:

TEST(FortranArrayView, CArrayReferenceIsBindable) {
                float data[1][2][3][4];
                bindgen_fortran_array_descriptor descriptor{bindgen_fk_Float, 4, {4, 3, 2, 1}, &data[0]};

                auto &view = make_fortran_array_view<float(&)[1][2][3][4]>(&descriptor);
                static_assert(std::is_same<decltype(view), float(&)[1][2][3][4]>::value, "");
                EXPECT_EQ(view, descriptor.data);

                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3][3]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[2][2][3][4]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3][4][5]>(&descriptor), std::runtime_error);
            }